

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uart.c
# Opt level: O3

int main(int argc,char **argv)

{
  long lVar1;
  int iVar2;
  char buffer [12];
  undefined8 local_20;
  undefined4 local_18;
  
  local_20 = 0x724d206f6c6c6548;
  local_18 = 0x216161;
  signal(2,sig_handler);
  mraa_init();
  lVar1 = mraa_uart_init(0);
  if (lVar1 == 0) {
    main_cold_1();
    iVar2 = 1;
  }
  else {
    if (flag != 0) {
      do {
        mraa_uart_write(lVar1,&local_20,0xc);
        sleep(1);
      } while (flag != 0);
    }
    mraa_uart_stop(lVar1);
    iVar2 = 0;
    mraa_deinit();
  }
  return iVar2;
}

Assistant:

int
main(int argc, char** argv)
{
    mraa_uart_context uart;
    char buffer[] = "Hello Mraa!";

    /* install signal handler */
    signal(SIGINT, sig_handler);

    /* initialize mraa for the platform (not needed most of the times) */
    mraa_init();

    //! [Interesting]
    /* initialize UART */
    uart = mraa_uart_init(UART);
    if (uart == NULL) {
        fprintf(stderr, "Failed to initialize UART\n");
        goto err_exit;
    }

    while (flag) {
        /* send data through UART */
        mraa_uart_write(uart, buffer, sizeof(buffer));

        sleep(1);
    }

    /* stop UART */
    mraa_uart_stop(uart);

    //! [Interesting]
    /* deinitialize mraa for the platform (not needed most of the times) */
    mraa_deinit();

    return EXIT_SUCCESS;

err_exit:
    /* deinitialize mraa for the platform (not needed most of the times) */
    mraa_deinit();

    return EXIT_FAILURE;
}